

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitNumberOf
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,NumberOfExpr e)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  
  pBVar2 = this->writer_->buffer_;
  sVar3 = pBVar2->size_;
  uVar1 = sVar3 + 9;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar3 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar3,"numberof ",9);
  pBVar2->size_ = uVar1;
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ +
             8))->impl_,0);
  pBVar2 = this->writer_->buffer_;
  sVar3 = pBVar2->size_;
  uVar1 = sVar3 + 4;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar3 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar3," in ",4);
  pBVar2->size_ = uVar1;
  ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
            ((ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *)this,
             (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                             super_ExprBase.impl_ + 0x10),
             (Impl **)((long)*(int *)((long)e.
                                            super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                            super_ExprBase.impl_ + 4) * 8 +
                      (long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase
                            .impl_ + 8),", ",0);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitNumberOf(NumberOfExpr e) {
  writer_ << "numberof ";
  typename NumberOfExpr::iterator i = e.begin();
  Visit(*i++, prec::UNKNOWN);
  writer_ << " in ";
  WriteArgs(i, e.end());
}